

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope_test.cpp
# Opt level: O1

function_interface function_example_singleton(void)

{
  return &function_example_singleton::example_interface;
}

Assistant:

function_interface function_example_singleton()
{
	static struct function_interface_type example_interface = {
		&function_example_interface_create,
		&function_example_interface_invoke,
		&function_example_interface_await,
		&function_example_interface_destroy
	};

	return &example_interface;
}